

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_value.h
# Opt level: O2

void __thiscall
polyscope::PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue
          (PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this)

{
  set(this,this->value);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~PersistentValue() { set(value); }